

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O2

shared_ptr<phyr::Shape>
phyr::createSphereShape(Transform *o2w,Transform *w2o,bool reverseNormals,double radius)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<phyr::Shape> sVar2;
  Transform *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  bool local_20 [8];
  double local_18;
  Transform *local_10;
  
  std::make_shared<phyr::Sphere,phyr::Transform_const*&,phyr::Transform_const*&,double&,bool&>
            (&local_38,&local_10,&local_18,local_20);
  _Var1._M_pi = a_Stack_30[0]._M_pi;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI->_vptr_Shape = (_func_int **)local_38;
  in_RDI->localToWorld = (Transform *)_Var1._M_pi;
  local_38 = (Transform *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
  sVar2.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<phyr::Shape>)sVar2.super___shared_ptr<phyr::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Shape> createSphereShape(const Transform* o2w,
                                         const Transform* w2o,
                                         bool reverseNormals, Real radius) {
    return std::make_shared<Sphere>(o2w, w2o, radius, reverseNormals);
}